

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexmetadata.cpp
# Opt level: O3

QString * __thiscall
QHexMetadata::getComment
          (QString *__return_storage_ptr__,QHexMetadata *this,qint64 line,qint64 column)

{
  long lVar1;
  QHexMetadataItem *pQVar2;
  QHexMetadataLine *pQVar3;
  qint64 qVar4;
  QHexMetadataItem *pQVar5;
  QString *args;
  QByteArrayView QVar6;
  QHexPosition pos;
  QStringList comments;
  QArrayDataPointer<QString> local_58;
  QArrayData *local_40;
  undefined8 *local_38;
  
  qVar4 = column;
  pQVar3 = find(this,line);
  if (pQVar3 == (QHexMetadataLine *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pos.column = qVar4;
    pos.line = column;
    qVar4 = QHexUtils::positionToOffset((QHexUtils *)this->m_options,(QHexOptions *)line,pos);
    local_58.d = (Data *)0x0;
    local_58.ptr = (QString *)0x0;
    local_58.size = 0;
    lVar1 = (pQVar3->d).size;
    if (lVar1 != 0) {
      pQVar2 = (pQVar3->d).ptr;
      args = &pQVar2->comment;
      do {
        if (((((QHexMetadataItem *)(args + -2))->begin <= qVar4) &&
            (qVar4 <= ((QHexMetadataItem *)(args + -2))->end)) && ((args->d).size != 0)) {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)&local_58,local_58.size,args);
        }
        pQVar5 = (QHexMetadataItem *)(args + 1);
        args = args + 3;
      } while (pQVar5 != pQVar2 + lVar1);
    }
    QVar6.m_data = (storage_type *)0x1;
    QVar6.m_size = (qsizetype)&local_40;
    QString::fromUtf8(QVar6);
    if (local_38 == (undefined8 *)0x0) {
      local_38 = &QString::_empty;
    }
    QtPrivate::QStringList_join
              ((QList *)__return_storage_ptr__,(QChar *)&local_58,(longlong)local_38);
    if (local_40 != (QArrayData *)0x0) {
      LOCK();
      (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40,2,8);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QHexMetadata::getComment(qint64 line, qint64 column) const {
    auto* metadataline = this->find(line);
    if(!metadataline)
        return QString();

    auto offset = QHexUtils::positionToOffset(m_options, {line, column});
    QStringList comments;

    for(auto& mi : *metadataline) {
        if((offset < mi.begin || offset > mi.end) || mi.comment.isEmpty())
            continue;
        comments.push_back(mi.comment);
    }

    return comments.join("\n");
}